

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::CustomHeap::Allocation,_RealCount>::RemoveElement<Memory::ArenaAllocator>
          (DListBase<Memory::CustomHeap::Allocation,_RealCount> *this,ArenaAllocator *allocator,
          Allocation *element)

{
  BYTE *pBVar1;
  code *pcVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  bool bVar10;
  DListNode<Memory::CustomHeap::Allocation> *pDVar11;
  undefined4 *puVar12;
  undefined1 *buffer;
  
  buffer = &element[-1].field_0x28;
  pDVar11 = (DListNode<Memory::CustomHeap::Allocation> *)this;
  do {
    pDVar11 = (pDVar11->super_DListNodeBase<Memory::CustomHeap::Allocation>).next.node;
    if (pDVar11 == (DListNode<Memory::CustomHeap::Allocation> *)this) break;
  } while (pDVar11 != (DListNode<Memory::CustomHeap::Allocation> *)buffer);
  if (pDVar11 == (DListNode<Memory::CustomHeap::Allocation> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                        ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar10) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar12 = 0;
  }
  uVar3 = element[-1].field_0x29;
  uVar4 = element[-1].field_0x2a;
  uVar5 = element[-1].field_0x2b;
  uVar6 = element[-1].field_0x2c;
  uVar7 = element[-1].field_0x2d;
  uVar8 = element[-1].field_0x2e;
  uVar9 = element[-1].field_0x2f;
  pBVar1 = element[-1].xdata.super_SecondaryAllocation.address;
  pBVar1[0] = element[-1].field_0x28;
  pBVar1[1] = uVar3;
  pBVar1[2] = uVar4;
  pBVar1[3] = uVar5;
  pBVar1[4] = uVar6;
  pBVar1[5] = uVar7;
  pBVar1[6] = uVar8;
  pBVar1[7] = uVar9;
  *(BYTE **)(*(long *)buffer + 8) = element[-1].xdata.super_SecondaryAllocation.address;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x48);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }